

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall testing::Matcher<const_bool_&>::Matcher(Matcher<const_bool_&> *this,bool *value)

{
  MatcherBase<const_bool_&> local_28;
  
  (this->super_MatcherBase<const_bool_&>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<const_bool_&>).buffer_.ptr = (void *)0x0;
  (this->super_MatcherBase<const_bool_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_018a6fe8;
  local_28.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<bool_const&>::
       GetVTable<testing::internal::MatcherBase<bool_const&>::ValuePolicy<testing::internal::EqMatcher<bool>,true>>()
       ::kVTable;
  local_28.buffer_.i._1_7_ = 0;
  local_28.buffer_.i._0_1_ = *value;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_018a6fe8;
  testing::internal::MatcherBase<const_bool_&>::operator=
            (&this->super_MatcherBase<const_bool_&>,&local_28);
  testing::internal::MatcherBase<const_bool_&>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}